

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O2

bool __thiscall inja::Parser::parse_expression_not(Parser *this,Template *tmpl)

{
  basic_string_view<char,_std::char_traits<char>_> lhs;
  bool bVar1;
  type rhs;
  
  if (((this->m_tok).kind == Id) &&
     (lhs.data_ = (this->m_tok).text.data_, lhs.size_ = (this->m_tok).text.size_, rhs.size_ = 3,
     rhs.data_ = "not", bVar1 = nonstd::sv_lite::operator==(lhs,rhs), bVar1)) {
    get_next_token(this);
    bVar1 = parse_expression_not(this,tmpl);
    if (bVar1) {
      append_function(this,tmpl,Not,1);
    }
    return bVar1;
  }
  bVar1 = parse_expression_comparison(this,tmpl);
  return bVar1;
}

Assistant:

bool parse_expression_not(Template& tmpl) {
		if (m_tok.kind == Token::Kind::Id && m_tok.text == "not") {
			get_next_token();
			if (!parse_expression_not(tmpl)) return false;
			append_function(tmpl, Bytecode::Op::Not, 1);
			return true;
		} else {
			return parse_expression_comparison(tmpl);
		}
	}